

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetadataTree.cpp
# Opt level: O3

ostream * __thiscall cali::internal::MetadataTree::print_statistics(MetadataTree *this,ostream *os)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"  Metadata tree: ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," blocks, ",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," nodes\n   ",10);
  MemoryPool::print_statistics(&this->m_mempool,poVar1);
  return os;
}

Assistant:

std::ostream& MetadataTree::print_statistics(std::ostream& os) const
{
    m_mempool.print_statistics(
        os << "  Metadata tree: " << m_num_blocks << " blocks, " << m_num_nodes << " nodes\n   "
    );

    return os;
}